

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSurface.hpp
# Opt level: O0

PixelBufferAccess * __thiscall
tcu::Surface::getAccess(PixelBufferAccess *__return_storage_ptr__,Surface *this)

{
  int width;
  int height;
  bool bVar1;
  void *local_48;
  TextureFormat local_20;
  Surface *local_18;
  Surface *this_local;
  
  local_18 = this;
  this_local = (Surface *)__return_storage_ptr__;
  TextureFormat::TextureFormat(&local_20,RGBA,UNORM_INT8);
  width = this->m_width;
  height = this->m_height;
  bVar1 = de::ArrayBuffer<unsigned_int,_4UL,_4UL>::empty(&this->m_pixels);
  if (bVar1) {
    local_48 = (void *)0x0;
  }
  else {
    local_48 = de::ArrayBuffer<unsigned_int,_4UL,_4UL>::getPtr(&this->m_pixels);
  }
  PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,&local_20,width,height,1,local_48);
  return __return_storage_ptr__;
}

Assistant:

inline PixelBufferAccess Surface::getAccess (void)
{
	return PixelBufferAccess(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), m_width, m_height, 1, m_pixels.empty() ? DE_NULL : m_pixels.getPtr());
}